

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

CBNode * __thiscall asmjit::CodeBuilder::addNode(CodeBuilder *this,CBNode *node)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  CBNode *in_RSI;
  long in_RDI;
  CBNode *next;
  CBNode *prev;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  
  if (in_RSI == (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (in_RSI->_prev == (CBNode *)0x0) {
    if (in_RSI->_next == (CBNode *)0x0) {
      if (*(long *)(in_RDI + 0x180) == 0) {
        if (*(long *)(in_RDI + 0x170) == 0) {
          *(CBNode **)(in_RDI + 0x170) = in_RSI;
          *(CBNode **)(in_RDI + 0x178) = in_RSI;
        }
        else {
          in_RSI->_next = *(CBNode **)(in_RDI + 0x170);
          **(undefined8 **)(in_RDI + 0x170) = in_RSI;
          *(CBNode **)(in_RDI + 0x170) = in_RSI;
        }
      }
      else {
        pCVar1 = *(CBNode **)(in_RDI + 0x180);
        pCVar2 = *(CBNode **)(*(long *)(in_RDI + 0x180) + 8);
        in_RSI->_prev = pCVar1;
        in_RSI->_next = pCVar2;
        pCVar1->_next = in_RSI;
        if (pCVar2 == (CBNode *)0x0) {
          *(CBNode **)(in_RDI + 0x178) = in_RSI;
        }
        else {
          pCVar2->_prev = in_RSI;
        }
      }
      *(CBNode **)(in_RDI + 0x180) = in_RSI;
      return in_RSI;
    }
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
}

Assistant:

CBNode* CodeBuilder::addNode(CBNode* node) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  if (!_cursor) {
    if (!_firstNode) {
      _firstNode = node;
      _lastNode = node;
    }
    else {
      node->_next = _firstNode;
      _firstNode->_prev = node;
      _firstNode = node;
    }
  }
  else {
    CBNode* prev = _cursor;
    CBNode* next = _cursor->_next;

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _lastNode = node;
  }

  _cursor = node;
  return node;
}